

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::BinaryExpr<CLI::Option_*const_&,_CLI::Option_*const_&>::streamReconstructedExpression
          (BinaryExpr<CLI::Option_*const_&,_CLI::Option_*const_&> *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  string *in_R9;
  StringRef op;
  Option *in_stack_ffffffffffffff98;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  StringMaker<CLI::Option_*,_void>::convert<CLI::Option>(in_stack_ffffffffffffff98);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  StringMaker<CLI::Option_*,_void>::convert<CLI::Option>(in_stack_ffffffffffffff98);
  op.m_size = (size_type)local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)local_40,lhs,op,in_R9);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }